

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  bool bVar37;
  undefined1 auVar38 [16];
  undefined4 uVar39;
  AABBNodeMB4D *node1;
  ulong uVar40;
  ulong uVar41;
  int iVar42;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar43;
  size_t sVar44;
  ulong uVar45;
  long lVar46;
  ulong uVar47;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar55;
  float fVar67;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar65 [32];
  undefined8 extraout_XMM1_Qa_00;
  float fVar68;
  undefined1 auVar66 [64];
  float fVar69;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [32];
  float fVar88;
  undefined1 auVar87 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [64];
  float fVar98;
  undefined1 auVar99 [16];
  float fVar104;
  undefined1 auVar100 [16];
  float fVar102;
  float fVar103;
  undefined1 auVar101 [64];
  uint uVar105;
  undefined1 auVar106 [16];
  uint uVar108;
  uint uVar109;
  uint uVar110;
  undefined1 auVar107 [64];
  undefined1 auVar111 [16];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  float fVar114;
  float fVar120;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar118;
  float fVar119;
  undefined1 auVar117 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 local_14c8 [16];
  int local_14ac;
  undefined1 local_14a8 [16];
  undefined1 local_1498 [16];
  undefined1 local_1488 [16];
  RTCIntersectArguments *local_1470;
  ulong local_1468;
  ulong local_1460;
  Scene *local_1458;
  undefined8 uStack_1450;
  ulong local_1440;
  ulong local_1438;
  ulong local_1430;
  ulong local_1428;
  ulong local_1420;
  NodeRef *local_1418;
  RayQueryContext *local_1410;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  auVar38 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar55 = ray->tfar;
    auVar78 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar55) {
      local_1418 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar56 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar3 = (ray->dir).field_0;
      auVar49._8_4_ = 0x7fffffff;
      auVar49._0_8_ = 0x7fffffff7fffffff;
      auVar49._12_4_ = 0x7fffffff;
      auVar49 = vandps_avx((undefined1  [16])aVar3,auVar49);
      auVar89._8_4_ = 0x219392ef;
      auVar89._0_8_ = 0x219392ef219392ef;
      auVar89._12_4_ = 0x219392ef;
      auVar49 = vcmpps_avx(auVar49,auVar89,1);
      auVar49 = vblendvps_avx((undefined1  [16])aVar3,auVar89,auVar49);
      auVar89 = vrcpps_avx(auVar49);
      fVar67 = auVar89._0_4_;
      auVar79._0_4_ = fVar67 * auVar49._0_4_;
      fVar68 = auVar89._4_4_;
      auVar79._4_4_ = fVar68 * auVar49._4_4_;
      fVar69 = auVar89._8_4_;
      auVar79._8_4_ = fVar69 * auVar49._8_4_;
      fVar88 = auVar89._12_4_;
      auVar79._12_4_ = fVar88 * auVar49._12_4_;
      auVar90._8_4_ = 0x3f800000;
      auVar90._0_8_ = &DAT_3f8000003f800000;
      auVar90._12_4_ = 0x3f800000;
      auVar49 = vsubps_avx(auVar90,auVar79);
      uVar39 = *(undefined4 *)&(ray->org).field_0;
      local_11f8._4_4_ = uVar39;
      local_11f8._0_4_ = uVar39;
      local_11f8._8_4_ = uVar39;
      local_11f8._12_4_ = uVar39;
      local_11f8._16_4_ = uVar39;
      local_11f8._20_4_ = uVar39;
      local_11f8._24_4_ = uVar39;
      local_11f8._28_4_ = uVar39;
      auVar94 = ZEXT3264(local_11f8);
      uVar39 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1218._4_4_ = uVar39;
      local_1218._0_4_ = uVar39;
      local_1218._8_4_ = uVar39;
      local_1218._12_4_ = uVar39;
      local_1218._16_4_ = uVar39;
      local_1218._20_4_ = uVar39;
      local_1218._24_4_ = uVar39;
      local_1218._28_4_ = uVar39;
      auVar97 = ZEXT3264(local_1218);
      auVar80._0_4_ = fVar67 + fVar67 * auVar49._0_4_;
      auVar80._4_4_ = fVar68 + fVar68 * auVar49._4_4_;
      auVar80._8_4_ = fVar69 + fVar69 * auVar49._8_4_;
      auVar80._12_4_ = fVar88 + fVar88 * auVar49._12_4_;
      uVar39 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1238._4_4_ = uVar39;
      local_1238._0_4_ = uVar39;
      local_1238._8_4_ = uVar39;
      local_1238._12_4_ = uVar39;
      local_1238._16_4_ = uVar39;
      local_1238._20_4_ = uVar39;
      local_1238._24_4_ = uVar39;
      local_1238._28_4_ = uVar39;
      auVar101 = ZEXT3264(local_1238);
      auVar49 = vshufps_avx(auVar80,auVar80,0);
      local_1258._16_16_ = auVar49;
      local_1258._0_16_ = auVar49;
      auVar107 = ZEXT3264(local_1258);
      auVar49 = vmovshdup_avx(auVar80);
      auVar87 = ZEXT1664(auVar49);
      auVar89 = vshufps_avx(auVar80,auVar80,0x55);
      local_1278._16_16_ = auVar89;
      local_1278._0_16_ = auVar89;
      auVar112 = ZEXT3264(local_1278);
      auVar89 = vshufpd_avx(auVar80,auVar80,1);
      auVar79 = vshufps_avx(auVar80,auVar80,0xaa);
      auVar85 = ZEXT1664(auVar79);
      local_1420 = (ulong)(auVar80._0_4_ < 0.0) << 5;
      local_1428 = (ulong)(auVar49._0_4_ < 0.0) << 5 | 0x40;
      local_1298._16_16_ = auVar79;
      local_1298._0_16_ = auVar79;
      auVar92 = ZEXT3264(local_1298);
      local_1430 = (ulong)(auVar89._0_4_ < 0.0) << 5 | 0x80;
      local_1438 = local_1420 ^ 0x20;
      uVar47 = local_1428 ^ 0x20;
      uVar45 = local_1430 ^ 0x20;
      auVar49 = vshufps_avx(auVar56,auVar56,0);
      auVar66 = ZEXT1664(auVar49);
      local_12b8._16_16_ = auVar49;
      local_12b8._0_16_ = auVar49;
      auVar113 = ZEXT3264(local_12b8);
      auVar49 = vshufps_avx(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55),0);
      local_12d8._16_16_ = auVar49;
      local_12d8._0_16_ = auVar49;
      auVar117 = ZEXT3264(local_12d8);
      local_1410 = context;
      local_1468 = uVar45;
      local_1460 = uVar47;
      do {
        if (local_1418 == stack) {
          return;
        }
        sVar44 = local_1418[-1].ptr;
        local_1418 = local_1418 + -1;
        do {
          if ((sVar44 & 8) == 0) {
            uVar40 = sVar44 & 0xfffffffffffffff0;
            fVar55 = (ray->dir).field_0.m128[3];
            auVar54._4_4_ = fVar55;
            auVar54._0_4_ = fVar55;
            auVar54._8_4_ = fVar55;
            auVar54._12_4_ = fVar55;
            auVar54._16_4_ = fVar55;
            auVar54._20_4_ = fVar55;
            auVar54._24_4_ = fVar55;
            auVar54._28_4_ = fVar55;
            pfVar2 = (float *)(uVar40 + 0x100 + local_1420);
            pfVar1 = (float *)(uVar40 + 0x40 + local_1420);
            auVar65._0_4_ = fVar55 * *pfVar2 + *pfVar1;
            auVar65._4_4_ = fVar55 * pfVar2[1] + pfVar1[1];
            auVar65._8_4_ = fVar55 * pfVar2[2] + pfVar1[2];
            auVar65._12_4_ = fVar55 * pfVar2[3] + pfVar1[3];
            auVar65._16_4_ = fVar55 * pfVar2[4] + pfVar1[4];
            auVar65._20_4_ = fVar55 * pfVar2[5] + pfVar1[5];
            auVar65._24_4_ = fVar55 * pfVar2[6] + pfVar1[6];
            auVar65._28_4_ = auVar66._28_4_ + pfVar1[7];
            auVar65 = vsubps_avx(auVar65,auVar94._0_32_);
            auVar31._4_4_ = auVar107._4_4_ * auVar65._4_4_;
            auVar31._0_4_ = auVar107._0_4_ * auVar65._0_4_;
            auVar31._8_4_ = auVar107._8_4_ * auVar65._8_4_;
            auVar31._12_4_ = auVar107._12_4_ * auVar65._12_4_;
            auVar31._16_4_ = auVar107._16_4_ * auVar65._16_4_;
            auVar31._20_4_ = auVar107._20_4_ * auVar65._20_4_;
            auVar31._24_4_ = auVar107._24_4_ * auVar65._24_4_;
            auVar31._28_4_ = auVar65._28_4_;
            pfVar2 = (float *)(uVar40 + 0x100 + local_1428);
            pfVar1 = (float *)(uVar40 + 0x40 + local_1428);
            auVar76._0_4_ = fVar55 * *pfVar2 + *pfVar1;
            auVar76._4_4_ = fVar55 * pfVar2[1] + pfVar1[1];
            auVar76._8_4_ = fVar55 * pfVar2[2] + pfVar1[2];
            auVar76._12_4_ = fVar55 * pfVar2[3] + pfVar1[3];
            auVar76._16_4_ = fVar55 * pfVar2[4] + pfVar1[4];
            auVar76._20_4_ = fVar55 * pfVar2[5] + pfVar1[5];
            auVar76._24_4_ = fVar55 * pfVar2[6] + pfVar1[6];
            auVar76._28_4_ = auVar78._28_4_ + pfVar1[7];
            auVar65 = vmaxps_avx(auVar113._0_32_,auVar31);
            auVar31 = vsubps_avx(auVar76,auVar97._0_32_);
            pfVar2 = (float *)(uVar40 + 0x100 + local_1430);
            auVar32._4_4_ = auVar112._4_4_ * auVar31._4_4_;
            auVar32._0_4_ = auVar112._0_4_ * auVar31._0_4_;
            auVar32._8_4_ = auVar112._8_4_ * auVar31._8_4_;
            auVar32._12_4_ = auVar112._12_4_ * auVar31._12_4_;
            auVar32._16_4_ = auVar112._16_4_ * auVar31._16_4_;
            auVar32._20_4_ = auVar112._20_4_ * auVar31._20_4_;
            auVar32._24_4_ = auVar112._24_4_ * auVar31._24_4_;
            auVar32._28_4_ = auVar31._28_4_;
            pfVar1 = (float *)(uVar40 + 0x40 + local_1430);
            auVar83._0_4_ = fVar55 * *pfVar2 + *pfVar1;
            auVar83._4_4_ = fVar55 * pfVar2[1] + pfVar1[1];
            auVar83._8_4_ = fVar55 * pfVar2[2] + pfVar1[2];
            auVar83._12_4_ = fVar55 * pfVar2[3] + pfVar1[3];
            auVar83._16_4_ = fVar55 * pfVar2[4] + pfVar1[4];
            auVar83._20_4_ = fVar55 * pfVar2[5] + pfVar1[5];
            auVar83._24_4_ = fVar55 * pfVar2[6] + pfVar1[6];
            auVar83._28_4_ = auVar85._28_4_ + pfVar1[7];
            auVar31 = vsubps_avx(auVar83,auVar101._0_32_);
            auVar33._4_4_ = auVar92._4_4_ * auVar31._4_4_;
            auVar33._0_4_ = auVar92._0_4_ * auVar31._0_4_;
            auVar33._8_4_ = auVar92._8_4_ * auVar31._8_4_;
            auVar33._12_4_ = auVar92._12_4_ * auVar31._12_4_;
            auVar33._16_4_ = auVar92._16_4_ * auVar31._16_4_;
            auVar33._20_4_ = auVar92._20_4_ * auVar31._20_4_;
            fVar67 = auVar31._28_4_;
            auVar33._24_4_ = auVar92._24_4_ * auVar31._24_4_;
            auVar33._28_4_ = fVar67;
            auVar31 = vmaxps_avx(auVar32,auVar33);
            pfVar2 = (float *)(uVar40 + 0x100 + local_1438);
            auVar65 = vmaxps_avx(auVar65,auVar31);
            pfVar1 = (float *)(uVar40 + 0x40 + local_1438);
            auVar77._0_4_ = fVar55 * *pfVar2 + *pfVar1;
            auVar77._4_4_ = fVar55 * pfVar2[1] + pfVar1[1];
            auVar77._8_4_ = fVar55 * pfVar2[2] + pfVar1[2];
            auVar77._12_4_ = fVar55 * pfVar2[3] + pfVar1[3];
            auVar77._16_4_ = fVar55 * pfVar2[4] + pfVar1[4];
            auVar77._20_4_ = fVar55 * pfVar2[5] + pfVar1[5];
            auVar77._24_4_ = fVar55 * pfVar2[6] + pfVar1[6];
            auVar77._28_4_ = fVar67 + pfVar1[7];
            auVar31 = vsubps_avx(auVar77,auVar94._0_32_);
            auVar34._4_4_ = auVar107._4_4_ * auVar31._4_4_;
            auVar34._0_4_ = auVar107._0_4_ * auVar31._0_4_;
            auVar34._8_4_ = auVar107._8_4_ * auVar31._8_4_;
            auVar34._12_4_ = auVar107._12_4_ * auVar31._12_4_;
            auVar34._16_4_ = auVar107._16_4_ * auVar31._16_4_;
            auVar34._20_4_ = auVar107._20_4_ * auVar31._20_4_;
            auVar34._24_4_ = auVar107._24_4_ * auVar31._24_4_;
            auVar34._28_4_ = auVar31._28_4_;
            auVar31 = vminps_avx(auVar117._0_32_,auVar34);
            pfVar2 = (float *)(uVar40 + 0x100 + uVar47);
            pfVar1 = (float *)(uVar40 + 0x40 + uVar47);
            auVar84._0_4_ = fVar55 * *pfVar2 + *pfVar1;
            auVar84._4_4_ = fVar55 * pfVar2[1] + pfVar1[1];
            auVar84._8_4_ = fVar55 * pfVar2[2] + pfVar1[2];
            auVar84._12_4_ = fVar55 * pfVar2[3] + pfVar1[3];
            auVar84._16_4_ = fVar55 * pfVar2[4] + pfVar1[4];
            auVar84._20_4_ = fVar55 * pfVar2[5] + pfVar1[5];
            auVar84._24_4_ = fVar55 * pfVar2[6] + pfVar1[6];
            auVar84._28_4_ = fVar67 + pfVar1[7];
            auVar32 = vsubps_avx(auVar84,auVar97._0_32_);
            auVar35._4_4_ = auVar112._4_4_ * auVar32._4_4_;
            auVar35._0_4_ = auVar112._0_4_ * auVar32._0_4_;
            auVar35._8_4_ = auVar112._8_4_ * auVar32._8_4_;
            auVar35._12_4_ = auVar112._12_4_ * auVar32._12_4_;
            auVar35._16_4_ = auVar112._16_4_ * auVar32._16_4_;
            auVar35._20_4_ = auVar112._20_4_ * auVar32._20_4_;
            auVar35._24_4_ = auVar112._24_4_ * auVar32._24_4_;
            auVar35._28_4_ = auVar32._28_4_;
            pfVar2 = (float *)(uVar40 + 0x100 + uVar45);
            pfVar1 = (float *)(uVar40 + 0x40 + uVar45);
            auVar86._0_4_ = fVar55 * *pfVar2 + *pfVar1;
            auVar86._4_4_ = fVar55 * pfVar2[1] + pfVar1[1];
            auVar86._8_4_ = fVar55 * pfVar2[2] + pfVar1[2];
            auVar86._12_4_ = fVar55 * pfVar2[3] + pfVar1[3];
            auVar86._16_4_ = fVar55 * pfVar2[4] + pfVar1[4];
            auVar86._20_4_ = fVar55 * pfVar2[5] + pfVar1[5];
            auVar86._24_4_ = fVar55 * pfVar2[6] + pfVar1[6];
            auVar86._28_4_ = auVar87._28_4_ + pfVar1[7];
            auVar32 = vsubps_avx(auVar86,auVar101._0_32_);
            auVar36._4_4_ = auVar92._4_4_ * auVar32._4_4_;
            auVar36._0_4_ = auVar92._0_4_ * auVar32._0_4_;
            auVar36._8_4_ = auVar92._8_4_ * auVar32._8_4_;
            auVar36._12_4_ = auVar92._12_4_ * auVar32._12_4_;
            auVar36._16_4_ = auVar92._16_4_ * auVar32._16_4_;
            auVar36._20_4_ = auVar92._20_4_ * auVar32._20_4_;
            auVar36._24_4_ = auVar92._24_4_ * auVar32._24_4_;
            auVar36._28_4_ = auVar32._28_4_;
            auVar87 = ZEXT3264(auVar36);
            auVar32 = vminps_avx(auVar35,auVar36);
            auVar85 = ZEXT3264(auVar32);
            auVar31 = vminps_avx(auVar31,auVar32);
            auVar65 = vcmpps_avx(auVar65,auVar31,2);
            auVar66 = ZEXT3264(auVar65);
            if (((uint)sVar44 & 7) == 6) {
              auVar31 = vcmpps_avx(*(undefined1 (*) [32])(uVar40 + 0x1c0),auVar54,2);
              auVar32 = vcmpps_avx(auVar54,*(undefined1 (*) [32])(uVar40 + 0x1e0),1);
              auVar32 = vandps_avx(auVar31,auVar32);
              auVar65 = vandps_avx(auVar32,auVar65);
              auVar66 = ZEXT1664(auVar65._16_16_);
              auVar49 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
            }
            else {
              auVar49 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
            }
            auVar78 = ZEXT3264(auVar31);
            auVar49 = vpsllw_avx(auVar49,0xf);
            auVar49 = vpacksswb_avx(auVar49,auVar49);
            unaff_RBX = (ulong)(byte)(SUB161(auVar49 >> 7,0) & 1 |
                                      (SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                                      (SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                                      (SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                                      (SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                                      (SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                                      (SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                                     SUB161(auVar49 >> 0x3f,0) << 7);
          }
          if ((sVar44 & 8) == 0) {
            if (unaff_RBX == 0) {
              iVar42 = 4;
            }
            else {
              uVar40 = sVar44 & 0xfffffffffffffff0;
              lVar46 = 0;
              if (unaff_RBX != 0) {
                for (; (unaff_RBX >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                }
              }
              iVar42 = 0;
              sVar44 = *(size_t *)(uVar40 + lVar46 * 8);
              uVar43 = unaff_RBX - 1 & unaff_RBX;
              if (uVar43 != 0) {
                local_1418->ptr = sVar44;
                lVar46 = 0;
                if (uVar43 != 0) {
                  for (; (uVar43 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                  }
                }
                uVar41 = uVar43 - 1;
                while( true ) {
                  local_1418 = local_1418 + 1;
                  sVar44 = *(size_t *)(uVar40 + lVar46 * 8);
                  uVar41 = uVar41 & uVar43;
                  if (uVar41 == 0) break;
                  local_1418->ptr = sVar44;
                  lVar46 = 0;
                  if (uVar41 != 0) {
                    for (; (uVar41 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                    }
                  }
                  uVar43 = uVar41 - 1;
                }
                iVar42 = 0;
              }
            }
          }
          else {
            iVar42 = 6;
          }
        } while (iVar42 == 0);
        if (iVar42 == 6) {
          local_1440 = (ulong)((uint)sVar44 & 0xf) - 8;
          bVar48 = local_1440 != 0;
          if (bVar48) {
            uVar45 = sVar44 & 0xfffffffffffffff0;
            uVar47 = 0;
            do {
              lVar46 = uVar47 * 0x140;
              fVar55 = (ray->dir).field_0.m128[3];
              pfVar2 = (float *)(uVar45 + 0x90 + lVar46);
              pfVar1 = (float *)(uVar45 + lVar46);
              auVar95._0_4_ = fVar55 * *pfVar2 + *pfVar1;
              auVar95._4_4_ = fVar55 * pfVar2[1] + pfVar1[1];
              auVar95._8_4_ = fVar55 * pfVar2[2] + pfVar1[2];
              auVar95._12_4_ = fVar55 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar45 + 0xa0 + lVar46);
              pfVar1 = (float *)(uVar45 + 0x10 + lVar46);
              auVar91._0_4_ = fVar55 * *pfVar2 + *pfVar1;
              auVar91._4_4_ = fVar55 * pfVar2[1] + pfVar1[1];
              auVar91._8_4_ = fVar55 * pfVar2[2] + pfVar1[2];
              auVar91._12_4_ = fVar55 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar45 + 0xb0 + lVar46);
              pfVar1 = (float *)(uVar45 + 0x20 + lVar46);
              auVar93._0_4_ = fVar55 * *pfVar2 + *pfVar1;
              auVar93._4_4_ = fVar55 * pfVar2[1] + pfVar1[1];
              auVar93._8_4_ = fVar55 * pfVar2[2] + pfVar1[2];
              auVar93._12_4_ = fVar55 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar45 + 0xc0 + lVar46);
              pfVar1 = (float *)(uVar45 + 0x30 + lVar46);
              auVar56._0_4_ = fVar55 * *pfVar2 + *pfVar1;
              auVar56._4_4_ = fVar55 * pfVar2[1] + pfVar1[1];
              auVar56._8_4_ = fVar55 * pfVar2[2] + pfVar1[2];
              auVar56._12_4_ = fVar55 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar45 + 0xd0 + lVar46);
              pfVar1 = (float *)(uVar45 + 0x40 + lVar46);
              auVar70._0_4_ = fVar55 * *pfVar2 + *pfVar1;
              auVar70._4_4_ = fVar55 * pfVar2[1] + pfVar1[1];
              auVar70._8_4_ = fVar55 * pfVar2[2] + pfVar1[2];
              auVar70._12_4_ = fVar55 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar45 + 0xe0 + lVar46);
              pfVar1 = (float *)(uVar45 + 0x50 + lVar46);
              auVar99._0_4_ = fVar55 * *pfVar2 + *pfVar1;
              auVar99._4_4_ = fVar55 * pfVar2[1] + pfVar1[1];
              auVar99._8_4_ = fVar55 * pfVar2[2] + pfVar1[2];
              auVar99._12_4_ = fVar55 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar45 + 0xf0 + lVar46);
              pfVar1 = (float *)(uVar45 + 0x60 + lVar46);
              auVar106._0_4_ = fVar55 * *pfVar2 + *pfVar1;
              auVar106._4_4_ = fVar55 * pfVar2[1] + pfVar1[1];
              auVar106._8_4_ = fVar55 * pfVar2[2] + pfVar1[2];
              auVar106._12_4_ = fVar55 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar45 + 0x100 + lVar46);
              pfVar1 = (float *)(uVar45 + 0x70 + lVar46);
              auVar111._0_4_ = fVar55 * *pfVar2 + *pfVar1;
              auVar111._4_4_ = fVar55 * pfVar2[1] + pfVar1[1];
              auVar111._8_4_ = fVar55 * pfVar2[2] + pfVar1[2];
              auVar111._12_4_ = fVar55 * pfVar2[3] + pfVar1[3];
              pfVar1 = (float *)(uVar45 + 0x110 + lVar46);
              pfVar2 = (float *)(uVar45 + 0x80 + lVar46);
              auVar50._0_4_ = fVar55 * *pfVar1 + *pfVar2;
              auVar50._4_4_ = fVar55 * pfVar1[1] + pfVar2[1];
              auVar50._8_4_ = fVar55 * pfVar1[2] + pfVar2[2];
              auVar50._12_4_ = fVar55 * pfVar1[3] + pfVar2[3];
              local_14c8 = vsubps_avx(auVar95,auVar56);
              local_1488 = vsubps_avx(auVar91,auVar70);
              auVar49 = vsubps_avx(auVar93,auVar99);
              auVar56 = vsubps_avx(auVar106,auVar95);
              auVar89 = vsubps_avx(auVar111,auVar91);
              auVar79 = vsubps_avx(auVar50,auVar93);
              fVar69 = auVar79._0_4_;
              fVar114 = local_1488._0_4_;
              auVar51._0_4_ = fVar114 * fVar69;
              fVar10 = auVar79._4_4_;
              fVar118 = local_1488._4_4_;
              auVar51._4_4_ = fVar118 * fVar10;
              fVar17 = auVar79._8_4_;
              fVar119 = local_1488._8_4_;
              auVar51._8_4_ = fVar119 * fVar17;
              fVar24 = auVar79._12_4_;
              fVar120 = local_1488._12_4_;
              auVar51._12_4_ = fVar120 * fVar24;
              fVar88 = auVar89._0_4_;
              fVar98 = auVar49._0_4_;
              auVar57._0_4_ = fVar98 * fVar88;
              fVar11 = auVar89._4_4_;
              fVar102 = auVar49._4_4_;
              auVar57._4_4_ = fVar102 * fVar11;
              fVar18 = auVar89._8_4_;
              fVar103 = auVar49._8_4_;
              auVar57._8_4_ = fVar103 * fVar18;
              fVar25 = auVar89._12_4_;
              fVar104 = auVar49._12_4_;
              auVar57._12_4_ = fVar104 * fVar25;
              local_1498 = vsubps_avx(auVar57,auVar51);
              fVar5 = auVar56._0_4_;
              auVar58._0_4_ = fVar98 * fVar5;
              fVar12 = auVar56._4_4_;
              auVar58._4_4_ = fVar102 * fVar12;
              fVar19 = auVar56._8_4_;
              auVar58._8_4_ = fVar103 * fVar19;
              fVar26 = auVar56._12_4_;
              auVar58._12_4_ = fVar104 * fVar26;
              fVar6 = local_14c8._0_4_;
              auVar71._0_4_ = fVar69 * fVar6;
              fVar13 = local_14c8._4_4_;
              auVar71._4_4_ = fVar10 * fVar13;
              fVar20 = local_14c8._8_4_;
              auVar71._8_4_ = fVar17 * fVar20;
              fVar27 = local_14c8._12_4_;
              auVar71._12_4_ = fVar24 * fVar27;
              local_12f8 = vsubps_avx(auVar71,auVar58);
              auVar72._0_4_ = fVar88 * fVar6;
              auVar72._4_4_ = fVar11 * fVar13;
              auVar72._8_4_ = fVar18 * fVar20;
              auVar72._12_4_ = fVar25 * fVar27;
              auVar115._0_4_ = fVar114 * fVar5;
              auVar115._4_4_ = fVar118 * fVar12;
              auVar115._8_4_ = fVar119 * fVar19;
              auVar115._12_4_ = fVar120 * fVar26;
              auVar79 = vsubps_avx(auVar115,auVar72);
              uVar39 = *(undefined4 *)&(ray->org).field_0;
              auVar116._4_4_ = uVar39;
              auVar116._0_4_ = uVar39;
              auVar116._8_4_ = uVar39;
              auVar116._12_4_ = uVar39;
              uVar39 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar121._4_4_ = uVar39;
              auVar121._0_4_ = uVar39;
              auVar121._8_4_ = uVar39;
              auVar121._12_4_ = uVar39;
              uVar39 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar123._4_4_ = uVar39;
              auVar123._0_4_ = uVar39;
              auVar123._8_4_ = uVar39;
              auVar123._12_4_ = uVar39;
              fVar55 = (ray->dir).field_0.m128[1];
              local_14a8 = vsubps_avx(auVar95,auVar116);
              fVar67 = (ray->dir).field_0.m128[2];
              auVar49 = vsubps_avx(auVar91,auVar121);
              auVar56 = vsubps_avx(auVar93,auVar123);
              fVar7 = auVar56._0_4_;
              auVar122._0_4_ = fVar55 * fVar7;
              fVar14 = auVar56._4_4_;
              auVar122._4_4_ = fVar55 * fVar14;
              fVar21 = auVar56._8_4_;
              auVar122._8_4_ = fVar55 * fVar21;
              fVar28 = auVar56._12_4_;
              auVar122._12_4_ = fVar55 * fVar28;
              fVar8 = auVar49._0_4_;
              auVar124._0_4_ = fVar67 * fVar8;
              fVar15 = auVar49._4_4_;
              auVar124._4_4_ = fVar67 * fVar15;
              fVar22 = auVar49._8_4_;
              auVar124._8_4_ = fVar67 * fVar22;
              fVar29 = auVar49._12_4_;
              auVar124._12_4_ = fVar67 * fVar29;
              auVar56 = vsubps_avx(auVar124,auVar122);
              fVar68 = (ray->dir).field_0.m128[0];
              fVar9 = local_14a8._0_4_;
              auVar52._0_4_ = fVar67 * fVar9;
              fVar16 = local_14a8._4_4_;
              auVar52._4_4_ = fVar67 * fVar16;
              fVar23 = local_14a8._8_4_;
              auVar52._8_4_ = fVar67 * fVar23;
              fVar30 = local_14a8._12_4_;
              auVar52._12_4_ = fVar67 * fVar30;
              auVar59._0_4_ = fVar68 * fVar7;
              auVar59._4_4_ = fVar68 * fVar14;
              auVar59._8_4_ = fVar68 * fVar21;
              auVar59._12_4_ = fVar68 * fVar28;
              auVar89 = vsubps_avx(auVar59,auVar52);
              auVar60._0_4_ = fVar68 * fVar8;
              auVar60._4_4_ = fVar68 * fVar15;
              auVar60._8_4_ = fVar68 * fVar22;
              auVar60._12_4_ = fVar68 * fVar29;
              auVar73._0_4_ = fVar55 * fVar9;
              auVar73._4_4_ = fVar55 * fVar16;
              auVar73._8_4_ = fVar55 * fVar23;
              auVar73._12_4_ = fVar55 * fVar30;
              auVar80 = vsubps_avx(auVar73,auVar60);
              auVar85 = ZEXT1664(local_1498);
              auVar74._0_4_ =
                   fVar68 * local_1498._0_4_ + fVar55 * local_12f8._0_4_ + fVar67 * auVar79._0_4_;
              auVar74._4_4_ =
                   fVar68 * local_1498._4_4_ + fVar55 * local_12f8._4_4_ + fVar67 * auVar79._4_4_;
              auVar74._8_4_ =
                   fVar68 * local_1498._8_4_ + fVar55 * local_12f8._8_4_ + fVar67 * auVar79._8_4_;
              auVar74._12_4_ =
                   fVar68 * local_1498._12_4_ + fVar55 * local_12f8._12_4_ + fVar67 * auVar79._12_4_
              ;
              auVar78 = ZEXT1664(auVar74);
              auVar61._8_8_ = 0x8000000080000000;
              auVar61._0_8_ = 0x8000000080000000;
              auVar49 = vandps_avx(auVar74,auVar61);
              uVar105 = auVar49._0_4_;
              auVar96._0_4_ =
                   (float)(uVar105 ^
                          (uint)(fVar5 * auVar56._0_4_ +
                                fVar88 * auVar89._0_4_ + fVar69 * auVar80._0_4_));
              uVar108 = auVar49._4_4_;
              auVar96._4_4_ =
                   (float)(uVar108 ^
                          (uint)(fVar12 * auVar56._4_4_ +
                                fVar11 * auVar89._4_4_ + fVar10 * auVar80._4_4_));
              uVar109 = auVar49._8_4_;
              auVar96._8_4_ =
                   (float)(uVar109 ^
                          (uint)(fVar19 * auVar56._8_4_ +
                                fVar18 * auVar89._8_4_ + fVar17 * auVar80._8_4_));
              uVar110 = auVar49._12_4_;
              auVar96._12_4_ =
                   (float)(uVar110 ^
                          (uint)(fVar26 * auVar56._12_4_ +
                                fVar25 * auVar89._12_4_ + fVar24 * auVar80._12_4_));
              auVar100._0_4_ =
                   (float)(uVar105 ^
                          (uint)(auVar56._0_4_ * fVar6 +
                                auVar89._0_4_ * fVar114 + fVar98 * auVar80._0_4_));
              auVar100._4_4_ =
                   (float)(uVar108 ^
                          (uint)(auVar56._4_4_ * fVar13 +
                                auVar89._4_4_ * fVar118 + fVar102 * auVar80._4_4_));
              auVar100._8_4_ =
                   (float)(uVar109 ^
                          (uint)(auVar56._8_4_ * fVar20 +
                                auVar89._8_4_ * fVar119 + fVar103 * auVar80._8_4_));
              auVar100._12_4_ =
                   (float)(uVar110 ^
                          (uint)(auVar56._12_4_ * fVar27 +
                                auVar89._12_4_ * fVar120 + fVar104 * auVar80._12_4_));
              auVar89 = ZEXT416(0) << 0x20;
              auVar49 = vcmpps_avx(auVar96,auVar89,5);
              auVar56 = vcmpps_avx(auVar100,auVar89,5);
              auVar49 = vandps_avx(auVar49,auVar56);
              auVar62._8_4_ = 0x7fffffff;
              auVar62._0_8_ = 0x7fffffff7fffffff;
              auVar62._12_4_ = 0x7fffffff;
              auVar56 = vandps_avx(auVar74,auVar62);
              auVar87 = ZEXT1664(auVar56);
              auVar89 = vcmpps_avx(auVar89,auVar74,4);
              auVar49 = vandps_avx(auVar49,auVar89);
              auVar63._0_4_ = auVar100._0_4_ + auVar96._0_4_;
              auVar63._4_4_ = auVar100._4_4_ + auVar96._4_4_;
              auVar63._8_4_ = auVar100._8_4_ + auVar96._8_4_;
              auVar63._12_4_ = auVar100._12_4_ + auVar96._12_4_;
              auVar89 = vcmpps_avx(auVar63,auVar56,2);
              auVar66 = ZEXT1664(auVar89);
              auVar49 = vandps_avx(auVar49,auVar89);
              auVar89 = auVar38 & auVar49;
              if ((((auVar89 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar89 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar89 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar89[0xf] < '\0') {
                auVar49 = vandps_avx(auVar49,auVar38);
                auVar81._0_4_ =
                     (float)(uVar105 ^
                            (uint)(local_1498._0_4_ * fVar9 +
                                  local_12f8._0_4_ * fVar8 + fVar7 * auVar79._0_4_));
                auVar81._4_4_ =
                     (float)(uVar108 ^
                            (uint)(local_1498._4_4_ * fVar16 +
                                  local_12f8._4_4_ * fVar15 + fVar14 * auVar79._4_4_));
                auVar81._8_4_ =
                     (float)(uVar109 ^
                            (uint)(local_1498._8_4_ * fVar23 +
                                  local_12f8._8_4_ * fVar22 + fVar21 * auVar79._8_4_));
                auVar81._12_4_ =
                     (float)(uVar110 ^
                            (uint)(local_1498._12_4_ * fVar30 +
                                  local_12f8._12_4_ * fVar29 + fVar28 * auVar79._12_4_));
                auVar85 = ZEXT1664(auVar81);
                fVar55 = (ray->org).field_0.m128[3];
                fVar67 = auVar56._0_4_;
                auVar53._0_4_ = fVar67 * fVar55;
                fVar68 = auVar56._4_4_;
                auVar53._4_4_ = fVar68 * fVar55;
                fVar69 = auVar56._8_4_;
                auVar53._8_4_ = fVar69 * fVar55;
                fVar88 = auVar56._12_4_;
                auVar53._12_4_ = fVar88 * fVar55;
                auVar89 = vcmpps_avx(auVar53,auVar81,1);
                fVar55 = ray->tfar;
                auVar64._0_4_ = fVar67 * fVar55;
                auVar64._4_4_ = fVar68 * fVar55;
                auVar64._8_4_ = fVar69 * fVar55;
                auVar64._12_4_ = fVar88 * fVar55;
                auVar80 = vcmpps_avx(auVar81,auVar64,2);
                auVar66 = ZEXT1664(auVar80);
                auVar89 = vandps_avx(auVar80,auVar89);
                auVar80 = auVar49 & auVar89;
                if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar80[0xf] < '\0') {
                  auVar49 = vandps_avx(auVar49,auVar89);
                  local_1308 = local_1498;
                  local_1458 = auVar79._0_8_;
                  uStack_1450 = auVar79._8_8_;
                  local_12e8 = local_1458;
                  uStack_12e0 = uStack_1450;
                  local_1458 = local_1410->scene;
                  auVar56 = vrcpps_avx(auVar56);
                  fVar55 = auVar56._0_4_;
                  auVar75._0_4_ = fVar67 * fVar55;
                  fVar67 = auVar56._4_4_;
                  auVar75._4_4_ = fVar68 * fVar67;
                  fVar68 = auVar56._8_4_;
                  auVar75._8_4_ = fVar69 * fVar68;
                  fVar69 = auVar56._12_4_;
                  auVar75._12_4_ = fVar88 * fVar69;
                  auVar82._8_4_ = 0x3f800000;
                  auVar82._0_8_ = &DAT_3f8000003f800000;
                  auVar82._12_4_ = 0x3f800000;
                  auVar85 = ZEXT1664(auVar82);
                  auVar56 = vsubps_avx(auVar82,auVar75);
                  fVar55 = fVar55 + fVar55 * auVar56._0_4_;
                  fVar67 = fVar67 + fVar67 * auVar56._4_4_;
                  fVar68 = fVar68 + fVar68 * auVar56._8_4_;
                  fVar69 = fVar69 + fVar69 * auVar56._12_4_;
                  local_1318[0] = fVar55 * auVar81._0_4_;
                  local_1318[1] = fVar67 * auVar81._4_4_;
                  local_1318[2] = fVar68 * auVar81._8_4_;
                  local_1318[3] = fVar69 * auVar81._12_4_;
                  local_1338._0_4_ = fVar55 * auVar96._0_4_;
                  local_1338._4_4_ = fVar67 * auVar96._4_4_;
                  local_1338._8_4_ = fVar68 * auVar96._8_4_;
                  local_1338._12_4_ = fVar69 * auVar96._12_4_;
                  auVar78 = ZEXT1664(local_1338);
                  local_1328._0_4_ = fVar55 * auVar100._0_4_;
                  local_1328._4_4_ = fVar67 * auVar100._4_4_;
                  local_1328._8_4_ = fVar68 * auVar100._8_4_;
                  local_1328._12_4_ = fVar69 * auVar100._12_4_;
                  auVar66 = ZEXT1664(local_1328);
                  uVar39 = vmovmskps_avx(auVar49);
                  uVar40 = CONCAT44((int)((ulong)local_1410->scene >> 0x20),uVar39);
                  do {
                    local_14c8._0_8_ = uVar40;
                    uVar43 = 0;
                    if (uVar40 != 0) {
                      for (; (uVar40 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                      }
                    }
                    local_1498._0_8_ = uVar43;
                    h.geomID = *(uint *)(lVar46 + uVar45 + 0x120 + uVar43 * 4);
                    local_14a8._0_8_ = CONCAT44(0,h.geomID);
                    lVar4 = *(long *)(*(long *)((long)local_1458 + 0x1e8) + CONCAT44(0,h.geomID) * 8
                                     );
                    local_1488._0_8_ = lVar4;
                    if ((*(uint *)(lVar4 + 0x34) & ray->mask) == 0) {
                      local_14c8._0_8_ = uVar40 ^ 1L << (uVar43 & 0x3f);
                      bVar37 = true;
                    }
                    else {
                      local_1470 = local_1410->args;
                      if ((local_1470->filter == (RTCFilterFunctionN)0x0) &&
                         (*(long *)(lVar4 + 0x48) == 0)) {
                        bVar37 = false;
                      }
                      else {
                        h.u = *(float *)(local_1338 + uVar43 * 4);
                        h.v = *(float *)(local_1328 + uVar43 * 4);
                        auVar66 = ZEXT464((uint)h.v);
                        args.context = local_1410->user;
                        h.primID = *(uint *)(lVar46 + uVar45 + 0x130 + uVar43 * 4);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_1308 + uVar43 * 4);
                        auVar78 = ZEXT464((uint)h.Ng.field_0.field_0.x);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_12f8 + uVar43 * 4);
                        auVar85 = ZEXT464((uint)h.Ng.field_0.field_0.y);
                        h.Ng.field_0.field_0.z = *(float *)((long)&local_12e8 + uVar43 * 4);
                        auVar87 = ZEXT464((uint)h.Ng.field_0.field_0.z);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        local_14a8._0_4_ = ray->tfar;
                        ray->tfar = local_1318[uVar43];
                        local_14ac = -1;
                        args.valid = &local_14ac;
                        args.geometryUserPtr = *(void **)(lVar4 + 0x18);
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if (*(code **)(lVar4 + 0x48) == (code *)0x0) {
LAB_003078a4:
                          if (local_1470->filter != (RTCFilterFunctionN)0x0) {
                            if (((local_1470->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               ((*(byte *)(local_1488._0_8_ + 0x3e) & 0x40) != 0)) {
                              auVar78 = ZEXT1664(auVar78._0_16_);
                              auVar85 = ZEXT1664(auVar85._0_16_);
                              auVar87 = ZEXT1664(auVar87._0_16_);
                              (*local_1470->filter)(&args);
                              auVar66._8_56_ = extraout_var_00;
                              auVar66._0_8_ = extraout_XMM1_Qa_00;
                            }
                            if (*args.valid == 0) goto LAB_003078e5;
                          }
                          bVar37 = false;
                        }
                        else {
                          auVar78 = ZEXT464((uint)h.Ng.field_0.field_0.x);
                          auVar85 = ZEXT464((uint)h.Ng.field_0.field_0.y);
                          auVar87 = ZEXT464((uint)h.Ng.field_0.field_0.z);
                          (**(code **)(lVar4 + 0x48))(&args);
                          auVar66._8_56_ = extraout_var;
                          auVar66._0_8_ = extraout_XMM1_Qa;
                          if (*args.valid != 0) goto LAB_003078a4;
LAB_003078e5:
                          ray->tfar = (float)local_14a8._0_4_;
                          local_14c8._0_8_ = uVar40 ^ 1L << (local_1498._0_8_ & 0x3f);
                          bVar37 = true;
                        }
                      }
                    }
                    iVar42 = 0;
                    if (!bVar37) {
                      auVar94 = ZEXT3264(local_11f8);
                      auVar97 = ZEXT3264(local_1218);
                      auVar101 = ZEXT3264(local_1238);
                      auVar107 = ZEXT3264(local_1258);
                      auVar112 = ZEXT3264(local_1278);
                      auVar92 = ZEXT3264(local_1298);
                      auVar113 = ZEXT3264(local_12b8);
                      auVar117 = ZEXT3264(local_12d8);
                      uVar45 = local_1468;
                      uVar47 = local_1460;
                      if (bVar48) {
                        ray->tfar = -INFINITY;
                        iVar42 = 3;
                      }
                      goto LAB_0030799d;
                    }
                    uVar40 = local_14c8._0_8_;
                  } while (local_14c8._0_8_ != 0);
                }
              }
              uVar47 = uVar47 + 1;
              bVar48 = uVar47 < local_1440;
            } while (uVar47 != local_1440);
            auVar94 = ZEXT3264(local_11f8);
            auVar97 = ZEXT3264(local_1218);
            auVar101 = ZEXT3264(local_1238);
            auVar107 = ZEXT3264(local_1258);
            auVar112 = ZEXT3264(local_1278);
            auVar92 = ZEXT3264(local_1298);
            auVar113 = ZEXT3264(local_12b8);
            auVar117 = ZEXT3264(local_12d8);
            uVar45 = local_1468;
            uVar47 = local_1460;
          }
          iVar42 = 0;
        }
LAB_0030799d:
      } while (iVar42 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }